

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void check_initializer(c2m_ctx_t c2m_ctx,decl_t member_decl,type **type_ptr,
                      node_t_conflict initializer,int const_only_p,int top_p)

{
  node_code_t nVar1;
  arr_type *paVar2;
  node_t pnVar3;
  byte *pbVar4;
  type *type;
  void *pvVar5;
  init_object_t obj;
  init_object_t obj_00;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  type **pptVar9;
  int iVar10;
  node_t_conflict pnVar11;
  node_t_conflict pnVar12;
  size_t mark;
  ulong uVar13;
  type *left;
  char *pcVar14;
  node_t_conflict pnVar15;
  type *type_00;
  node_t pnVar16;
  long lVar17;
  mir_llong *max_index_00;
  pos_t pVar18;
  mir_llong offset;
  int iStack_e8;
  uint uStack_e4;
  anon_union_8_2_e4b0c9a5_for_u local_e0;
  int addr_p;
  node_t local_d0;
  mir_llong max_index;
  type **local_c0;
  ulong local_b8;
  size_t local_b0;
  pos_t local_a8;
  pos_t local_98;
  pos_t local_88;
  int deref;
  symbol_t sym;
  
  left = *type_ptr;
  addr_p = 0;
  local_c0 = type_ptr;
  pnVar11 = get_compound_literal(initializer,&addr_p);
  if (((pnVar11 != (node_t_conflict)0x0) && (addr_p == 0)) && (2 < initializer->code - N_STR)) {
    check_assignment_types(c2m_ctx,left,(type *)0x0,(expr_conflict *)initializer->attr,initializer);
    initializer = DLIST_node_t_el(&(pnVar11->u).ops,1);
  }
  bVar6 = top_p == 0;
  do {
    nVar1 = initializer->code;
    if (nVar1 == N_LIST) {
      pnVar15 = (initializer->u).ops.head;
LAB_00156568:
      if (pnVar15 == (node_t_conflict)0x0) {
LAB_001566f1:
        iVar10 = scalar_type_p(left);
        if (iVar10 == 0) {
          return;
        }
        pVar18 = get_node_pos(c2m_ctx,initializer);
        pcVar14 = "empty scalar initializer";
        goto LAB_00156773;
      }
      if (pnVar15->code != N_INIT) goto LAB_00156e70;
      pnVar12 = DLIST_node_t_el(&(initializer->u).ops,1);
      if (pnVar12 == (node_t_conflict)0x0) {
        pnVar16 = (pnVar15->u).ops.head;
        if ((((pnVar16->code == N_LIST) && ((pnVar16->u).s.s == (char *)0x0)) &&
            (pnVar12 = DLIST_node_t_el(&(pnVar15->u).ops,1), pnVar12 != (node_t_conflict)0x0)) &&
           ((pnVar12->code - N_STR < 3 && (left->mode == TM_ARR)))) goto LAB_0015653b;
        goto LAB_001565d7;
      }
    }
    else {
      if ((left->mode != TM_ARR) ||
         (iVar10 = init_compatible_string_p(initializer,((left->u).ptr_type)->arr_type), iVar10 == 0
         )) {
        if (((nVar1 - N_STR < 2) ||
            (((undefined1  [64])
              ((undefined1  [64])*(expr_conflict *)initializer->attr & (undefined1  [64])0x1) !=
              (undefined1  [64])0x0 || (const_only_p == 0)))) || (nVar1 == N_STR32)) {
          check_assignment_types
                    (c2m_ctx,left,(type *)0x0,(expr_conflict *)initializer->attr,initializer);
          return;
        }
        iVar10 = check_const_addr_p(c2m_ctx,initializer,(node_t_conflict *)&sym,&offset,&deref);
        if ((iVar10 != 0) && (deref == 0)) {
          pbVar4 = (byte *)initializer->attr;
          *pbVar4 = *pbVar4 | 2;
          *(undefined8 *)(pbVar4 + 0x10) = sym._0_8_;
          *(mir_llong *)(pbVar4 + 0x30) = offset;
        }
        if (((undefined1  [64])
             ((undefined1  [64])*(expr_conflict *)initializer->attr & (undefined1  [64])0x2) ==
             (undefined1  [64])0x0) && ((pnVar11 == (node_t_conflict)0x0 || (addr_p == 0)))) {
          pVar18 = get_node_pos(c2m_ctx,initializer);
          error(c2m_ctx,0x18c11d,pVar18.fname,pVar18._8_8_);
          return;
        }
        check_assignment_types
                  (c2m_ctx,left,(type *)0x0,(expr_conflict *)initializer->attr,initializer);
        return;
      }
      pnVar15 = (initializer->u).ops.head;
      pnVar12 = initializer;
      if (2 < nVar1 - N_STR) goto LAB_00156568;
LAB_0015653b:
      paVar2 = (left->u).arr_type;
      iVar10 = init_compatible_string_p(pnVar12,paVar2->el_type);
      if (iVar10 != 0) {
        uVar13 = (pnVar12->u).s.len;
        iVar10 = incomplete_type_p(c2m_ctx,left);
        if (iVar10 != 0) {
          if (uVar13 < 0x7fffffff) {
            pVar18 = get_node_pos(c2m_ctx,paVar2->size);
            pnVar11 = new_i_node(c2m_ctx,uVar13,pVar18);
            ((left->u).arr_type)->size = pnVar11;
            check(c2m_ctx,((left->u).arr_type)->size,(node_t_conflict)0x0);
            make_type_complete(c2m_ctx,left);
            return;
          }
          __assert_fail("len < MIR_INT_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x1e1c,
                        "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
        if (uVar13 <= *(long *)((long)paVar2->size->attr + 0x30) + 1U) {
          return;
        }
        pVar18 = get_node_pos(c2m_ctx,initializer);
        pcVar14 = "string is too long for array initializer";
        goto LAB_00156773;
      }
      if (pnVar15 == (node_t_conflict)0x0) goto LAB_001566f1;
LAB_001565d7:
      if (pnVar15->code != N_INIT) {
LAB_00156e70:
        __assert_fail("init->code == N_INIT",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x1e29,
                      "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)")
        ;
      }
    }
    pnVar16 = (pnVar15->u).ops.head;
    if (pnVar16->code != N_LIST) {
      __assert_fail("des_list->code == N_LIST",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1e2b,
                    "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    if (left->mode - TM_STRUCT < 3) {
      mark = VARR_init_object_tlength(c2m_ctx->init_object_path);
      iStack_e8 = 0;
      offset = (mir_llong)left;
      if (left->mode == TM_ARR) {
        local_b8 = get_arr_type_size(left);
        local_b8 = local_b8 >> 0x3f;
        local_e0.curr_index = -1;
      }
      else {
        local_e0.curr_index = 0;
        local_b8 = 0;
      }
      obj._12_4_ = uStack_e4;
      obj.field_designator_p = iStack_e8;
      obj.container_type = (type *)offset;
      obj.u.curr_index = local_e0.curr_index;
      VARR_init_object_tpush(c2m_ctx->init_object_path,obj);
      max_index = -1;
      local_b0 = mark + 1;
      goto LAB_00156804;
    }
    pnVar12 = (pnVar15->op_link).next;
    if (pnVar12 != (node_t_conflict)0x0) {
      pVar18 = get_node_pos(c2m_ctx,pnVar12);
      pcVar14 = "excess elements in scalar initializer";
      goto LAB_00156773;
    }
    pnVar12 = (pnVar16->u).ops.head;
    if (pnVar12 != (node_t_conflict)0x0) {
      pVar18 = get_node_pos(c2m_ctx,pnVar12);
      pcVar14 = "designator in scalar initializer";
      goto LAB_00156773;
    }
    initializer = (pnVar16->op_link).next;
    bVar7 = !bVar6;
    bVar6 = true;
  } while (bVar7);
  pVar18 = get_node_pos(c2m_ctx,pnVar15);
  pcVar14 = "braces around scalar initializer";
LAB_00156773:
  error(c2m_ctx,pcVar14,pVar18.fname,pVar18._8_8_);
  return;
LAB_00156804:
  if (pnVar15 == (node_t_conflict)0x0) {
LAB_00156c4a:
    if (((left->mode == TM_ARR & (byte)local_b8) == 1) && (-1 < max_index)) {
      pnVar11 = (node_t_conflict)reg_malloc(c2m_ctx,0x20);
      left = create_type(c2m_ctx,left);
      iVar10 = incomplete_type_p(c2m_ctx,left);
      if (iVar10 == 0) {
        __assert_fail("incomplete_type_p (c2m_ctx, type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x1e9a,
                      "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)")
        ;
      }
      pnVar15 = (left->u).tag_type;
      uVar8 = pnVar15->uid;
      pvVar5 = pnVar15->attr;
      pnVar16 = (pnVar15->op_link).prev;
      pnVar3 = (pnVar15->op_link).next;
      pnVar11->code = pnVar15->code;
      pnVar11->uid = uVar8;
      pnVar11->attr = pvVar5;
      (pnVar11->op_link).prev = pnVar16;
      (pnVar11->op_link).next = pnVar3;
      (left->u).tag_type = pnVar11;
      pnVar11 = (pnVar11->op_link).next;
      if (max_index < 0x7fffffff) {
        lVar17 = max_index + 1;
        pVar18 = get_node_pos(c2m_ctx,pnVar11);
        pnVar11 = new_i_node(c2m_ctx,lVar17,pVar18);
      }
      else if (max_index == 0x7fffffffffffffff) {
        pVar18 = get_node_pos(c2m_ctx,pnVar11);
        pnVar11 = new_ll_node(c2m_ctx,-0x8000000000000000,pVar18);
      }
      else {
        lVar17 = max_index + 1;
        pVar18 = get_node_pos(c2m_ctx,pnVar11);
        pnVar11 = new_l_node(c2m_ctx,lVar17,pVar18);
      }
      ((left->u).arr_type)->size = pnVar11;
      check(c2m_ctx,((left->u).arr_type)->size,(node_t_conflict)0x0);
      make_type_complete(c2m_ctx,left);
    }
    pptVar9 = local_c0;
    VARR_init_object_ttrunc(c2m_ctx->init_object_path,mark);
    *pptVar9 = left;
    return;
  }
  if (pnVar15->code != N_INIT) {
    __assert_fail("init->code == N_INIT",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1e49,
                  "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
  }
  pnVar16 = (pnVar15->u).ops.head;
  local_d0 = (pnVar16->op_link).next;
  if (((local_d0->code == N_LIST) || (local_d0->code == N_COMPOUND_LITERAL)) &&
     (2 < left->mode - TM_STRUCT)) {
    pVar18 = get_node_pos(c2m_ctx,pnVar15);
    pcVar14 = "compound literal for scalar initializer";
    if (local_d0->code == N_LIST) {
      pcVar14 = "braces around scalar initializer";
    }
    error(c2m_ctx,pcVar14,pVar18.fname,pVar18._8_8_);
    goto LAB_00156c4a;
  }
  pnVar16 = (pnVar16->u).ops.head;
  if (pnVar16 == (node_t)0x0) {
    local_88 = get_node_pos(c2m_ctx,pnVar15);
    iVar10 = update_path_and_do(c2m_ctx,1,check_initializer,mark,local_d0,const_only_p,&max_index,
                                local_88,"array/struct/union");
    if (iVar10 == 0) goto LAB_00156c4a;
  }
  else {
    VARR_init_object_ttrunc(c2m_ctx->init_object_path,local_b0);
    bVar6 = false;
    type_00 = left;
    for (; pnVar16 != (node_t_conflict)0x0; pnVar16 = (pnVar16->op_link).next) {
      VARR_init_object_tlast((init_object_t *)&offset,c2m_ctx->init_object_path);
      if (bVar6) {
        if (*(int *)(offset + 0x18) - 4U < 2) {
          type_00 = *(type **)((long)(local_e0.curr_member)->attr + 0x40);
        }
        else {
          if (*(int *)(offset + 0x18) != 6) {
            __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x1e66,
                          "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
          type_00 = *(type **)(*(long *)(offset + 0x30) + 8);
        }
      }
      else {
        VARR_init_object_tpop((init_object_t *)&deref,c2m_ctx->init_object_path);
      }
      if (pnVar16->code == N_FIELD_ID) {
        if ((type_00->mode & ~TM_BASIC) == TM_STRUCT) {
          pnVar11 = (pnVar16->u).ops.head;
          iVar10 = symbol_find(c2m_ctx,S_REGULAR,pnVar11,(type_00->u).tag_type,&sym);
          if (iVar10 == 0) {
            pVar18 = get_node_pos(c2m_ctx,pnVar16);
            error(c2m_ctx,0x18c374,pVar18.fname,pVar18._8_8_,(pnVar11->u).s.s);
          }
          else {
            process_init_field_designator(c2m_ctx,sym.def_node,type_00);
            pnVar3 = (pnVar16->op_link).next;
            local_98 = get_node_pos(c2m_ctx,pnVar15);
            iVar10 = update_path_and_do(c2m_ctx,(uint)(pnVar3 == (node_t)0x0),check_initializer,mark
                                        ,local_d0,const_only_p,(mir_llong *)0x0,local_98,
                                        "struct/union");
LAB_0015698f:
            if (iVar10 == 0) break;
          }
        }
        else {
          pVar18 = get_node_pos(c2m_ctx,pnVar16);
          pcVar14 = "field name not in struct or union initializer";
LAB_00156a0d:
          error(c2m_ctx,pcVar14,pVar18.fname,pVar18._8_8_);
        }
      }
      else {
        if (type_00->mode != TM_ARR) {
          pVar18 = get_node_pos(c2m_ctx,pnVar16);
          pcVar14 = "array index in initializer for non-array";
          goto LAB_00156a0d;
        }
        pbVar4 = (byte *)pnVar16->attr;
        if ((*pbVar4 & 1) == 0) {
          pVar18 = get_node_pos(c2m_ctx,pnVar16);
          error(c2m_ctx,0x18c3bd,pVar18.fname,pVar18._8_8_);
        }
        else {
          type = *(type **)(pbVar4 + 0x18);
          iVar10 = integer_type_p(type);
          if (iVar10 == 0) {
            pVar18 = get_node_pos(c2m_ctx,pnVar16);
            pcVar14 = "array index in initializer not of integer type";
          }
          else {
            iVar10 = incomplete_type_p(c2m_ctx,type_00);
            if (((iVar10 == 0) || (iVar10 = signed_integer_type_p(type), iVar10 == 0)) ||
               (-1 < *(long *)(pbVar4 + 0x30))) {
              uVar13 = get_arr_type_size(type_00);
              if (((long)uVar13 < 0) || (*(ulong *)(pbVar4 + 0x30) < uVar13)) {
                local_e0.curr_member = (node_t_conflict)(*(ulong *)(pbVar4 + 0x30) - 1);
                iStack_e8 = 0;
                obj_00._8_8_ = (ulong)uStack_e4 << 0x20;
                obj_00.container_type = type_00;
                obj_00.u.curr_member = (node_t_conflict)local_e0.curr_index;
                offset = (mir_llong)type_00;
                VARR_init_object_tpush(c2m_ctx->init_object_path,obj_00);
                pnVar3 = (pnVar16->op_link).next;
                max_index_00 = &max_index;
                if (bVar6) {
                  max_index_00 = (mir_llong *)0x0;
                }
                local_a8 = get_node_pos(c2m_ctx,pnVar15);
                iVar10 = update_path_and_do(c2m_ctx,(uint)(pnVar3 == (node_t)0x0),check_initializer,
                                            mark,local_d0,const_only_p,max_index_00,local_a8,"array"
                                           );
                goto LAB_0015698f;
              }
              pVar18 = get_node_pos(c2m_ctx,pnVar16);
              pcVar14 = "array index in initializer exceeds array bounds";
            }
            else {
              pVar18 = get_node_pos(c2m_ctx,pnVar16);
              pcVar14 = "negative array index in initializer for array without size";
            }
          }
          error(c2m_ctx,pcVar14,pVar18.fname,pVar18._8_8_);
        }
      }
      bVar6 = true;
    }
  }
  pnVar15 = (pnVar15->op_link).next;
  goto LAB_00156804;
}

Assistant:

static void check_initializer (c2m_ctx_t c2m_ctx, decl_t member_decl MIR_UNUSED,
                               struct type **type_ptr, node_t initializer, int const_only_p,
                               int top_p) {
  struct type *type = *type_ptr;
  struct expr *cexpr;
  node_t literal, des_list, curr_des, init, str, value, size_node, temp;
  mir_llong max_index;
  mir_llong size_val = 0; /* to remove an uninitialized warning */
  size_t mark, len;
  symbol_t sym;
  init_object_t init_object;
  int addr_p = FALSE; /* to remove an uninitialized warning */

  literal = get_compound_literal (initializer, &addr_p);
  if (literal != NULL && !addr_p && initializer->code != N_STR && initializer->code != N_STR16
      && initializer->code != N_STR32) {
    cexpr = initializer->attr;
    check_assignment_types (c2m_ctx, type, NULL, cexpr, initializer);
    initializer = NL_EL (literal->u.ops, 1);
  }
check_one_value:
  if (initializer->code != N_LIST
      && !(type->mode == TM_ARR
           && init_compatible_string_p (initializer, type->u.arr_type->el_type))) {
    if ((cexpr = initializer->attr)->const_p || initializer->code == N_STR
        || initializer->code == N_STR16 || initializer->code == N_STR32 || !const_only_p) {
      check_assignment_types (c2m_ctx, type, NULL, cexpr, initializer);
    } else {
      setup_const_addr_p (c2m_ctx, initializer);
      if ((cexpr = initializer->attr)->const_addr_p || (literal != NULL && addr_p))
        check_assignment_types (c2m_ctx, type, NULL, cexpr, initializer);
      else
        error (c2m_ctx, POS (initializer),
               "initializer of non-auto or thread local object"
               " should be a constant expression or address");
    }
    return;
  }
  init = NL_HEAD (initializer->u.ops);
  if (((str = initializer)->code == N_STR || str->code == N_STR16
       || str->code == N_STR32 /* string or string in parentheses */
       || (init != NULL && init->code == N_INIT && NL_EL (initializer->u.ops, 1) == NULL
           && (des_list = NL_HEAD (init->u.ops))->code == N_LIST
           && NL_HEAD (des_list->u.ops) == NULL && NL_EL (init->u.ops, 1) != NULL
           && ((str = NL_EL (init->u.ops, 1))->code == N_STR || str->code == N_STR16
               || str->code == N_STR32)))
      && type->mode == TM_ARR && init_compatible_string_p (str, type->u.arr_type->el_type)) {
    len = str->u.s.len;
    if (incomplete_type_p (c2m_ctx, type)) {
      assert (len < MIR_INT_MAX);
      type->u.arr_type->size = new_i_node (c2m_ctx, (long) len, POS (type->u.arr_type->size));
      check (c2m_ctx, type->u.arr_type->size, NULL);
      make_type_complete (c2m_ctx, type);
    } else if (len > (size_t) ((struct expr *) type->u.arr_type->size->attr)->c.i_val + 1) {
      error (c2m_ctx, POS (initializer), "string is too long for array initializer");
    }
    return;
  }
  if (init == NULL) {
    if (scalar_type_p (type)) error (c2m_ctx, POS (initializer), "empty scalar initializer");
    return;
  }
  assert (init->code == N_INIT);
  des_list = NL_HEAD (init->u.ops);
  assert (des_list->code == N_LIST);
  if (type->mode != TM_ARR && type->mode != TM_STRUCT && type->mode != TM_UNION) {
    if ((temp = NL_NEXT (init)) != NULL) {
      error (c2m_ctx, POS (temp), "excess elements in scalar initializer");
      return;
    }
    if ((temp = NL_HEAD (des_list->u.ops)) != NULL) {
      error (c2m_ctx, POS (temp), "designator in scalar initializer");
      return;
    }
    initializer = NL_NEXT (des_list);
    if (!top_p) {
      error (c2m_ctx, POS (init), "braces around scalar initializer");
      return;
    }
    top_p = FALSE;
    goto check_one_value;
  }
  mark = VARR_LENGTH (init_object_t, init_object_path);
  init_object.container_type = type;
  init_object.field_designator_p = FALSE;
  if (type->mode == TM_ARR) {
    size_val = get_arr_type_size (type);
    init_object.u.curr_index = -1;
  } else {
    init_object.u.curr_member = NULL;
  }
  VARR_PUSH (init_object_t, init_object_path, init_object);
  max_index = -1;
  for (; init != NULL; init = NL_NEXT (init)) {
    assert (init->code == N_INIT);
    des_list = NL_HEAD (init->u.ops);
    value = NL_NEXT (des_list);
    if ((value->code == N_LIST || value->code == N_COMPOUND_LITERAL) && type->mode != TM_ARR
        && type->mode != TM_STRUCT && type->mode != TM_UNION) {
      error (c2m_ctx, POS (init),
             value->code == N_LIST ? "braces around scalar initializer"
                                   : "compound literal for scalar initializer");
      break;
    }
    if ((curr_des = NL_HEAD (des_list->u.ops)) == NULL) {
      if (!update_path_and_do (c2m_ctx, TRUE, check_initializer, mark, value, const_only_p,
                               &max_index, POS (init), "array/struct/union"))
        break;
    } else {
      struct type *curr_type = type;
      mir_llong arr_size_val MIR_UNUSED;
      int first_p = TRUE;

      VARR_TRUNC (init_object_t, init_object_path, mark + 1);
      for (; curr_des != NULL; curr_des = NL_NEXT (curr_des), first_p = FALSE) {
        init_object = VARR_LAST (init_object_t, init_object_path);
        if (first_p) {
          VARR_POP (init_object_t, init_object_path);
        } else {
          if (init_object.container_type->mode == TM_ARR) {
            curr_type = init_object.container_type->u.arr_type->el_type;
          } else {
            assert (init_object.container_type->mode == TM_STRUCT
                    || init_object.container_type->mode == TM_UNION);
            decl_t el_decl = init_object.u.curr_member->attr;
            curr_type = el_decl->decl_spec.type;
          }
        }
        if (curr_des->code == N_FIELD_ID) {
          node_t id = NL_HEAD (curr_des->u.ops);

          if (curr_type->mode != TM_STRUCT && curr_type->mode != TM_UNION) {
            error (c2m_ctx, POS (curr_des), "field name not in struct or union initializer");
          } else if (!symbol_find (c2m_ctx, S_REGULAR, id, curr_type->u.tag_type, &sym)) {
            error (c2m_ctx, POS (curr_des), "unknown field %s in initializer", id->u.s.s);
          } else {
            process_init_field_designator (c2m_ctx, sym.def_node, curr_type);
            if (!update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, check_initializer, mark,
                                     value, const_only_p, NULL, POS (init), "struct/union"))
              break;
          }
        } else if (curr_type->mode != TM_ARR) {
          error (c2m_ctx, POS (curr_des), "array index in initializer for non-array");
        } else if (!(cexpr = curr_des->attr)->const_p) {
          error (c2m_ctx, POS (curr_des), "nonconstant array index in initializer");
        } else if (!integer_type_p (cexpr->type)) {
          error (c2m_ctx, POS (curr_des), "array index in initializer not of integer type");
        } else if (incomplete_type_p (c2m_ctx, curr_type) && signed_integer_type_p (cexpr->type)
                   && cexpr->c.i_val < 0) {
          error (c2m_ctx, POS (curr_des),
                 "negative array index in initializer for array without size");
        } else if ((arr_size_val = get_arr_type_size (curr_type)) >= 0
                   && (mir_ullong) arr_size_val <= cexpr->c.u_val) {
          error (c2m_ctx, POS (curr_des), "array index in initializer exceeds array bounds");
        } else {
          init_object.u.curr_index = cexpr->c.i_val - 1; /* previous el */
          init_object.field_designator_p = FALSE;
          init_object.container_type = curr_type;
          VARR_PUSH (init_object_t, init_object_path, init_object);
          if (!update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, check_initializer, mark,
                                   value, const_only_p, first_p ? &max_index : NULL, POS (init),
                                   "array"))
            break;
        }
      }
    }
  }
  if (type->mode == TM_ARR && size_val < 0 && max_index >= 0) {
    /* Array w/o size: define it.  Copy the type as the incomplete
       type can be shared by declarations with different length
       initializers.  We need only one level of copying as sub-array
       can not have incomplete type with an initializer. */
    struct arr_type *arr_type = reg_malloc (c2m_ctx, sizeof (struct arr_type));

    type = create_type (c2m_ctx, type);
    assert (incomplete_type_p (c2m_ctx, type));
    *arr_type = *type->u.arr_type;
    type->u.arr_type = arr_type;
    size_node = type->u.arr_type->size;
    type->u.arr_type->size
      = (max_index < MIR_INT_MAX    ? new_i_node (c2m_ctx, (long) max_index + 1, POS (size_node))
         : max_index < MIR_LONG_MAX ? new_l_node (c2m_ctx, (long) max_index + 1, POS (size_node))
                                    : new_ll_node (c2m_ctx, max_index + 1, POS (size_node)));
    check (c2m_ctx, type->u.arr_type->size, NULL);
    make_type_complete (c2m_ctx, type);
  }
  VARR_TRUNC (init_object_t, init_object_path, mark);
  *type_ptr = type;
  return;
}